

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElH1.cpp
# Opt level: O0

void __thiscall
TPZCompElH1<pzshape::TPZShapeTetra>::Shape
          (TPZCompElH1<pzshape::TPZShapeTetra> *this,TPZVec<double> *pt,TPZFMatrix<double> *phi,
          TPZFMatrix<double> *dphi)

{
  byte bVar1;
  int iVar2;
  TPZGeoNode *this_00;
  long *plVar3;
  TPZConnect *this_01;
  long *in_RDI;
  TPZGeoEl *ref;
  int i;
  TPZManVector<int,_12> ord;
  TPZManVector<long,_4> id;
  TPZFMatrix<double> *in_stack_000017a0;
  TPZFMatrix<double> *in_stack_000017a8;
  TPZVec<int> *in_stack_000017b0;
  TPZVec<long> *in_stack_000017b8;
  TPZVec<double> *in_stack_000017c0;
  TPZManVector<int,_12> *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  TPZGeoEl *in_stack_fffffffffffffef0;
  long *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  TPZManVector<int,_12> *in_stack_ffffffffffffff10;
  int local_d0;
  TPZVec<int> local_b8 [2];
  undefined8 local_68;
  TPZVec<long> local_60 [3];
  
  local_68 = 0;
  TPZManVector<long,_4>::TPZManVector
            ((TPZManVector<long,_4> *)in_stack_ffffffffffffff10,
             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),in_stack_ffffffffffffff00
            );
  TPZManVector<int,_12>::TPZManVector
            (in_stack_ffffffffffffff10,CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)
             ,(int *)in_stack_ffffffffffffff00);
  TPZCompEl::Reference((TPZCompEl *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  for (local_d0 = 0; local_d0 < 4; local_d0 = local_d0 + 1) {
    this_00 = TPZGeoEl::NodePtr(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    iVar2 = TPZGeoNode::Id(this_00);
    plVar3 = TPZVec<long>::operator[](local_60,(long)local_d0);
    *plVar3 = (long)iVar2;
  }
  for (local_d0 = 0; local_d0 < 0xb; local_d0 = local_d0 + 1) {
    this_01 = (TPZConnect *)(**(code **)(*in_RDI + 0xa8))(in_RDI,local_d0 + 4);
    bVar1 = TPZConnect::Order(this_01);
    in_stack_fffffffffffffee0 =
         (TPZManVector<int,_12> *)TPZVec<int>::operator[](local_b8,(long)local_d0);
    *(uint *)&(in_stack_fffffffffffffee0->super_TPZVec<int>)._vptr_TPZVec = (uint)bVar1;
  }
  pzshape::TPZShapeTetra::Shape
            (in_stack_000017c0,in_stack_000017b8,in_stack_000017b0,in_stack_000017a8,
             in_stack_000017a0);
  TPZManVector<int,_12>::~TPZManVector(in_stack_fffffffffffffee0);
  TPZManVector<long,_4>::~TPZManVector((TPZManVector<long,_4> *)in_stack_fffffffffffffee0);
  return;
}

Assistant:

void TPZCompElH1<TSHAPE>::Shape(TPZVec<REAL> &pt, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi) {
	TPZManVector<int64_t,TSHAPE::NCornerNodes> id(TSHAPE::NCornerNodes,0);
	TPZManVector<int, TSHAPE::NSides-TSHAPE::NCornerNodes+1> ord(TSHAPE::NSides-TSHAPE::NCornerNodes,0);
	int i;
	TPZGeoEl *ref = this->Reference();
	for(i=0; i<TSHAPE::NCornerNodes; i++) {
		id[i] = ref->NodePtr(i)->Id();
	}
	for(i=0; i<TSHAPE::NSides-TSHAPE::NCornerNodes; i++) {
		ord[i] = this->Connect(i+TSHAPE::NCornerNodes).Order();
	}
	TSHAPE::Shape(pt,id,ord,phi,dphi);
}